

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2skin.cpp
# Opt level: O0

int32 rw::ps2::findVertexSkin(Geometry *g,uint32 *flags,uint32 mask,Vertex *v)

{
  bool32 bVar1;
  Skin *pSVar2;
  uint local_7c;
  int local_74;
  uint32 flag;
  int32 i;
  RGBA *cols;
  V3d *norms;
  TexCoords *tex1;
  TexCoords *tex;
  V3d *verts;
  uint8 *inds;
  float32 *wghts;
  Skin *skin;
  Vertex *v_local;
  uint32 mask_local;
  uint32 *flags_local;
  Geometry *g_local;
  
  pSVar2 = Skin::get(g);
  inds = (uint8 *)0x0;
  verts = (V3d *)0x0;
  if (pSVar2 != (Skin *)0x0) {
    inds = (uint8 *)pSVar2->weights;
    verts = (V3d *)pSVar2->indices;
  }
  tex = (TexCoords *)g->morphTargets->vertices;
  tex1 = g->texCoords[0];
  norms = (V3d *)g->texCoords[1];
  cols = (RGBA *)g->morphTargets->normals;
  _flag = g->colors;
  local_74 = 0;
  do {
    if (g->numVertices <= local_74) {
      return -1;
    }
    if (flags == (uint32 *)0x0) {
      local_7c = 0xffffffff;
    }
    else {
      local_7c = flags[local_74];
    }
    if ((((((mask & local_7c & 1) == 0) || (bVar1 = equal((V3d *)tex,&v->p), bVar1 != 0)) &&
         (((mask & local_7c & 0x10) == 0 || (bVar1 = equal((V3d *)cols,&v->n), bVar1 != 0)))) &&
        ((((mask & local_7c & 0x100) == 0 || (bVar1 = equal(_flag,&v->c), bVar1 != 0)) &&
         (((mask & local_7c & 0x1000) == 0 || (bVar1 = equal(tex1,&v->t), bVar1 != 0)))))) &&
       (((mask & local_7c & 0x2000) == 0 || (bVar1 = equal((TexCoords *)norms,&v->t1), bVar1 != 0)))
       ) {
      if ((mask & local_7c & 0x10000) == 0) {
        return local_74;
      }
      if ((*(float *)inds == (float)v->w[0]) && (!NAN(*(float *)inds) && !NAN((float)v->w[0]))) {
        if ((*(float *)(inds + 4) == (float)v->w[1]) &&
           (!NAN(*(float *)(inds + 4)) && !NAN((float)v->w[1]))) {
          if ((*(float *)(inds + 8) == (float)v->w[2]) &&
             (!NAN(*(float *)(inds + 8)) && !NAN((float)v->w[2]))) {
            if ((*(float *)(inds + 0xc) == (float)v->w[3]) &&
               ((((!NAN(*(float *)(inds + 0xc)) && !NAN((float)v->w[3]) &&
                  (*(uint8 *)&verts->x == v->i[0])) && (*(uint8 *)((long)&verts->x + 1) == v->i[1]))
                && ((*(uint8 *)((long)&verts->x + 2) == v->i[2] &&
                    (*(uint8 *)((long)&verts->x + 3) == v->i[3])))))) {
              return local_74;
            }
          }
        }
      }
    }
    tex = (TexCoords *)&tex[1].v;
    tex1 = tex1 + 1;
    norms = (V3d *)&norms->z;
    cols = cols + 3;
    _flag = _flag + 1;
    inds = inds + 0x10;
    verts = (V3d *)&verts->y;
    local_74 = local_74 + 1;
  } while( true );
}

Assistant:

int32
findVertexSkin(Geometry *g, uint32 flags[], uint32 mask, Vertex *v)
{
	Skin *skin = Skin::get(g);
	float32 *wghts = nil;
	uint8 *inds = nil;
	if(skin){
		wghts = skin->weights;
		inds = skin->indices;
	}

	V3d *verts = g->morphTargets[0].vertices;
	TexCoords *tex = g->texCoords[0];
	TexCoords *tex1 = g->texCoords[1];
	V3d *norms = g->morphTargets[0].normals;
	RGBA *cols = g->colors;

	for(int32 i = 0; i < g->numVertices; i++){
		uint32 flag = flags ? flags[i] : ~0;
		if(mask & flag & 0x1 && !equal(*verts, v->p))
			goto cont;
		if(mask & flag & 0x10 && !equal(*norms, v->n))
			goto cont;
		if(mask & flag & 0x100 && !equal(*cols, v->c))
			goto cont;
		if(mask & flag & 0x1000 && !equal(*tex, v->t))
			goto cont;
		if(mask & flag & 0x2000 && !equal(*tex1, v->t1))
			goto cont;
		if(mask & flag & 0x10000 &&
		   !(wghts[0] == v->w[0] && wghts[1] == v->w[1] &&
		     wghts[2] == v->w[2] && wghts[3] == v->w[3] &&
		     inds[0] == v->i[0] && inds[1] == v->i[1] &&
		     inds[2] == v->i[2] && inds[3] == v->i[3]))
			goto cont;
		return i;
	cont:
		verts++;
		tex++;
		tex1++;
		norms++;
		cols++;
		wghts += 4;
		inds += 4;
	}
	return -1;
}